

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

void ecdh_free_internal(mbedtls_ecdh_context_mbed *ctx)

{
  mbedtls_ecdh_context_mbed *ctx_local;
  
  mbedtls_ecp_group_free(&ctx->grp);
  mbedtls_mpi_free(&ctx->d);
  mbedtls_ecp_point_free(&ctx->Q);
  mbedtls_ecp_point_free(&ctx->Qp);
  mbedtls_mpi_free(&ctx->z);
  return;
}

Assistant:

static void ecdh_free_internal( mbedtls_ecdh_context_mbed *ctx )
{
    mbedtls_ecp_group_free( &ctx->grp );
    mbedtls_mpi_free( &ctx->d  );
    mbedtls_ecp_point_free( &ctx->Q   );
    mbedtls_ecp_point_free( &ctx->Qp  );
    mbedtls_mpi_free( &ctx->z  );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    mbedtls_ecp_restart_free( &ctx->rs );
#endif
}